

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeAnyTypeUrl
          (ParserImpl *this,string *full_type_name,string *prefix)

{
  string *__rhs;
  bool bVar1;
  int iVar2;
  long *plVar3;
  size_type *psVar4;
  string url3;
  string url2;
  string url1;
  string local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  string *local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  local_d0._M_string_length = 0;
  local_d0.field_2._M_local_buf[0] = '\0';
  local_f8 = prefix;
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  bVar1 = ConsumeIdentifier(this,&local_90);
  if (bVar1) {
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,".","");
    bVar1 = Consume(this,&local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    if (bVar1) {
      bVar1 = ConsumeIdentifier(this,&local_b0);
      if (bVar1) {
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,".","");
        bVar1 = Consume(this,&local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        }
        if (bVar1) {
          bVar1 = ConsumeIdentifier(this,&local_d0);
          if (bVar1) {
            local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"/","");
            bVar1 = Consume(this,&local_138);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_dataplus._M_p != &local_138.field_2) {
              operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1
                             );
            }
            if (bVar1) {
              bVar1 = ConsumeFullTypeName(this,full_type_name);
              if (bVar1) {
                std::operator+(&local_70,&local_90,".");
                std::operator+(&local_50,&local_70,&local_b0);
                plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
                local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                psVar4 = (size_type *)(plVar3 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar3 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar4) {
                  local_f0.field_2._M_allocated_capacity = *psVar4;
                  local_f0.field_2._8_8_ = plVar3[3];
                }
                else {
                  local_f0.field_2._M_allocated_capacity = *psVar4;
                  local_f0._M_dataplus._M_p = (pointer)*plVar3;
                }
                local_f0._M_string_length = plVar3[1];
                *plVar3 = (long)psVar4;
                plVar3[1] = 0;
                *(undefined1 *)(plVar3 + 2) = 0;
                std::operator+(&local_118,&local_f0,&local_d0);
                plVar3 = (long *)std::__cxx11::string::append((char *)&local_118);
                psVar4 = (size_type *)(plVar3 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar3 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar4) {
                  local_138.field_2._M_allocated_capacity = *psVar4;
                  local_138.field_2._8_8_ = plVar3[3];
                  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
                }
                else {
                  local_138.field_2._M_allocated_capacity = *psVar4;
                  local_138._M_dataplus._M_p = (pointer)*plVar3;
                }
                local_138._M_string_length = plVar3[1];
                *plVar3 = (long)psVar4;
                plVar3[1] = 0;
                *(undefined1 *)(plVar3 + 2) = 0;
                std::__cxx11::string::operator=((string *)local_f8,(string *)&local_138);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_138._M_dataplus._M_p != &local_138.field_2) {
                  operator_delete(local_138._M_dataplus._M_p,
                                  local_138.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_118._M_dataplus._M_p != &local_118.field_2) {
                  operator_delete(local_118._M_dataplus._M_p,
                                  local_118.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                  operator_delete(local_f0._M_dataplus._M_p,
                                  local_f0.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_50._M_dataplus._M_p != &local_50.field_2) {
                  operator_delete(local_50._M_dataplus._M_p,
                                  local_50.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_70._M_dataplus._M_p != &local_70.field_2) {
                  operator_delete(local_70._M_dataplus._M_p,
                                  local_70.field_2._M_allocated_capacity + 1);
                }
                __rhs = local_f8;
                iVar2 = std::__cxx11::string::compare((char *)local_f8);
                bVar1 = true;
                if (iVar2 == 0) goto LAB_0033848f;
                iVar2 = std::__cxx11::string::compare((char *)__rhs);
                if (iVar2 == 0) goto LAB_0033848f;
                std::operator+(&local_118,
                               "TextFormat::Parser for Any supports only type.googleapis.com and type.googleprod.com, but found \""
                               ,__rhs);
                plVar3 = (long *)std::__cxx11::string::append((char *)&local_118);
                local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
                psVar4 = (size_type *)(plVar3 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar3 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar4) {
                  local_138.field_2._M_allocated_capacity = *psVar4;
                  local_138.field_2._8_8_ = plVar3[3];
                }
                else {
                  local_138.field_2._M_allocated_capacity = *psVar4;
                  local_138._M_dataplus._M_p = (pointer)*plVar3;
                }
                local_138._M_string_length = plVar3[1];
                *plVar3 = (long)psVar4;
                plVar3[1] = 0;
                *(undefined1 *)(plVar3 + 2) = 0;
                ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column
                            ,&local_138);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_138._M_dataplus._M_p != &local_138.field_2) {
                  operator_delete(local_138._M_dataplus._M_p,
                                  local_138.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_118._M_dataplus._M_p != &local_118.field_2) {
                  operator_delete(local_118._M_dataplus._M_p,
                                  local_118.field_2._M_allocated_capacity + 1);
                }
              }
            }
          }
        }
      }
    }
  }
  bVar1 = false;
LAB_0033848f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,
                    CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                             local_d0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,
                    CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                             local_b0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  return bVar1;
}

Assistant:

bool ConsumeAnyTypeUrl(string* full_type_name, string* prefix) {
    // TODO(saito) Extend Consume() to consume multiple tokens at once, so that
    // this code can be written as just DO(Consume(kGoogleApisTypePrefix)).
    string url1, url2, url3;
    DO(ConsumeIdentifier(&url1));  // type
    DO(Consume("."));
    DO(ConsumeIdentifier(&url2));  // googleapis
    DO(Consume("."));
    DO(ConsumeIdentifier(&url3));  // com
    DO(Consume("/"));
    DO(ConsumeFullTypeName(full_type_name));

    *prefix = url1 + "." + url2 + "." + url3 + "/";
    if (*prefix != internal::kTypeGoogleApisComPrefix &&
        *prefix != internal::kTypeGoogleProdComPrefix) {
      ReportError("TextFormat::Parser for Any supports only "
                  "type.googleapis.com and type.googleprod.com, "
                  "but found \"" + *prefix + "\"");
      return false;
    }
    return true;
  }